

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O3

StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *
google::protobuf::json_internal::UnparseProto2Descriptor::GetString
          (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          Field f,string *scratch,Msg *msg)

{
  pointer pcVar1;
  string *psVar2;
  Metadata MVar3;
  
  MVar3 = Message::GetMetadata(msg);
  psVar2 = Reflection::GetStringReference(MVar3.reflection,msg,f,scratch);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  (__return_storage_ptr__->
  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>).field_1.data_._M_len =
       psVar2->_M_string_length;
  (__return_storage_ptr__->
  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>).field_1.data_._M_str =
       pcVar1;
  (__return_storage_ptr__->
  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>).field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
        )0x1;
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<absl::string_view> GetString(Field f,
                                                     std::string& scratch,
                                                     const Msg& msg) {
    return msg.GetReflection()->GetStringReference(msg, f, &scratch);
  }